

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

void graphics101::unordered_edges_from_triangles
               (vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
               Edges *edges_out)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  pointer pTVar5;
  _Base_ptr p_Var6;
  int iVar7;
  reference pvVar8;
  _Base_ptr p_Var9;
  Triangle *tri;
  pointer pTVar10;
  size_type __n;
  edge_set_t edges;
  pair<long,_long> local_70;
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = (triangles->
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar10 = (triangles->
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; pTVar10 != pTVar5; pTVar10 = pTVar10 + 1) {
    iVar2 = pTVar10->A;
    iVar3 = pTVar10->B;
    iVar7 = iVar3;
    if (iVar3 < iVar2) {
      iVar7 = iVar2;
      iVar2 = iVar3;
    }
    local_70.first = (long)iVar2;
    local_70.second = (long)iVar7;
    std::
    _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
    ::_M_insert_unique<std::pair<long,long>>
              ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                *)&local_60,&local_70);
    iVar2 = pTVar10->B;
    iVar3 = pTVar10->C;
    iVar7 = iVar3;
    if (iVar3 < iVar2) {
      iVar7 = iVar2;
      iVar2 = iVar3;
    }
    local_70.first = (long)iVar2;
    local_70.second = (long)iVar7;
    std::
    _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
    ::_M_insert_unique<std::pair<long,long>>
              ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                *)&local_60,&local_70);
    iVar2 = pTVar10->A;
    iVar3 = pTVar10->C;
    iVar7 = iVar2;
    if (iVar2 < iVar3) {
      iVar7 = iVar3;
      iVar3 = iVar2;
    }
    local_70.first = (long)iVar3;
    local_70.second = (long)iVar7;
    std::
    _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
    ::_M_insert_unique<std::pair<long,long>>
              ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                *)&local_60,&local_70);
  }
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::resize(edges_out,local_60._M_impl.super__Rb_tree_header._M_node_count);
  __n = 0;
  for (p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    _Var4 = p_Var9[1]._M_color;
    p_Var6 = p_Var9[1]._M_parent;
    pvVar8 = std::
             vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ::at(edges_out,__n);
    *pvVar8 = (value_type)((long)p_Var6 << 0x20 | (ulong)_Var4);
    __n = __n + 1;
  }
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void unordered_edges_from_triangles( const std::vector< Triangle >& triangles, HalfEdgeTriMesh::Edges& edges_out )
{
    typedef HalfEdgeTriMesh::Index Index;
    typedef HalfEdgeTriMesh::Edge Edge;
    typedef std::set< std::pair< Index, Index > > edge_set_t;
    edge_set_t edges;
    for( const auto& tri : triangles )
    {
        edges.insert( std::make_pair( std::min( tri[0], tri[1] ), std::max( tri[0], tri[1] ) ) );
        edges.insert( std::make_pair( std::min( tri[1], tri[2] ), std::max( tri[1], tri[2] ) ) );
        edges.insert( std::make_pair( std::min( tri[2], tri[0] ), std::max( tri[2], tri[0] ) ) );
    }

    edges_out.resize( edges.size() );
    int e = 0;
    for( const auto& it : edges )
    {
        edges_out.at(e) = Edge( it.first, it.second );
        ++e;
    }
}